

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O2

size_t __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Merge(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
        *this,Sketch *other_sketch)

{
  uint *puVar1;
  long lVar2;
  pointer puVar3;
  ulong uVar4;
  size_t sVar5;
  size_t i;
  size_t sVar6;
  ulong __new_size;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (long)(this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2;
  __new_size = (long)(*(long *)&other_sketch[1].m_implementation - other_sketch[1].m_canary) >> 2;
  if (uVar4 <= __new_size) {
    __new_size = uVar4;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_syndromes,__new_size);
  puVar3 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar5 = (long)(this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
  for (sVar6 = 0; sVar5 != sVar6; sVar6 = sVar6 + 1) {
    puVar1 = puVar3 + sVar6;
    *puVar1 = *puVar1 ^ *(uint *)(other_sketch[1].m_canary + sVar6 * 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return sVar5;
  }
  __stack_chk_fail();
}

Assistant:

size_t Merge(const Sketch* other_sketch) override
    {
        // Sad cast. This is safe only because the caller code in minisketch.cpp checks
        // that implementation and field size match.
        const SketchImpl* other = static_cast<const SketchImpl*>(other_sketch);
        m_syndromes.resize(std::min(m_syndromes.size(), other->m_syndromes.size()));
        for (size_t i = 0; i < m_syndromes.size(); ++i) {
            m_syndromes[i] ^= other->m_syndromes[i];
        }
        return m_syndromes.size();
    }